

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void action_lockpick(tgestate_t *state)

{
  doorindex_t *pdVar1;
  
  pdVar1 = get_nearest_door(state);
  if (pdVar1 != (doorindex_t *)0x0) {
    state->ptr_to_door_being_lockpicked = pdVar1;
    state->player_locked_out_until = state->game_counter + 0xff;
    state->vischars[0].flags = '\x01';
    queue_message(state,message_PICKING_THE_LOCK);
    return;
  }
  return;
}

Assistant:

void action_lockpick(tgestate_t *state)
{
  doorindex_t *pdoor; /* was HL */

  assert(state != NULL);

  pdoor = get_nearest_door(state);
  if (pdoor == NULL)
    return; /* No door nearby. */

  state->ptr_to_door_being_lockpicked = pdoor;
  state->player_locked_out_until = state->game_counter + 255;
  state->vischars[0].flags = vischar_FLAGS_PICKING_LOCK;
  queue_message(state, message_PICKING_THE_LOCK);
}